

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_set_socket_functions.c
# Opt level: O0

ares_socket_t default_asocket(int domain,int type,int protocol,void *user_data)

{
  int iVar1;
  undefined4 local_28;
  int local_24;
  int opt;
  ares_socket_t s;
  void *user_data_local;
  int protocol_local;
  int type_local;
  int domain_local;
  
  _opt = user_data;
  user_data_local._0_4_ = protocol;
  user_data_local._4_4_ = type;
  protocol_local = domain;
  local_24 = socket(domain,type,protocol);
  if (local_24 == -1) {
    return -1;
  }
  iVar1 = setsocknonblock(local_24,1);
  if ((iVar1 == 0) && (iVar1 = fcntl(local_24,2,1), iVar1 == 0)) {
    if (user_data_local._4_4_ == 1) {
      local_28 = 1;
      iVar1 = setsockopt(local_24,6,1,&local_28,4);
      if (iVar1 != 0) goto LAB_0011bbdd;
    }
    type_local = local_24;
  }
  else {
LAB_0011bbdd:
    default_aclose(local_24,_opt);
    type_local = -1;
  }
  return type_local;
}

Assistant:

static ares_socket_t default_asocket(int domain, int type, int protocol,
                                     void *user_data)
{
  ares_socket_t s;
  (void)user_data;

  s = socket(domain, type, protocol);
  if (s == ARES_SOCKET_BAD) {
    return s;
  }

  if (setsocknonblock(s, 1) != 0) {
    goto fail; /* LCOV_EXCL_LINE */
  }

#if defined(FD_CLOEXEC) && !defined(MSDOS)
  /* Configure the socket fd as close-on-exec. */
  if (fcntl(s, F_SETFD, FD_CLOEXEC) != 0) {
    goto fail; /* LCOV_EXCL_LINE */
  }
#endif

  /* No need to emit SIGPIPE on socket errors */
#if defined(SO_NOSIGPIPE)
  {
    int opt = 1;
    (void)setsockopt(s, SOL_SOCKET, SO_NOSIGPIPE, (void *)&opt, sizeof(opt));
  }
#endif


  if (type == SOCK_STREAM) {
    int opt = 1;

#ifdef TCP_NODELAY
    /*
     * Disable the Nagle algorithm (only relevant for TCP sockets, and thus not
     * in configure_socket). In general, in DNS lookups we're pretty much
     * interested in firing off a single request and then waiting for a reply,
     * so batching isn't very interesting.
     */
    if (setsockopt(s, IPPROTO_TCP, TCP_NODELAY, (void *)&opt, sizeof(opt)) !=
        0) {
      goto fail;
    }
#endif
  }

#if defined(IPV6_V6ONLY) && defined(USE_WINSOCK)
  /* Support for IPv4-mapped IPv6 addresses.
   * Linux kernel, NetBSD, FreeBSD and Darwin: default is off;
   * Windows Vista and later: default is on;
   * DragonFly BSD: acts like off, and dummy setting;
   * OpenBSD and earlier Windows: unsupported.
   * Linux: controlled by /proc/sys/net/ipv6/bindv6only.
   */
  if (domain == PF_INET6) {
    int on = 0;
    (void)setsockopt(s, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&on, sizeof(on));
  }
#endif

  return s;

fail:
  default_aclose(s, user_data);
  return ARES_SOCKET_BAD;
}